

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

uint64_t __thiscall relive::LogManager::symbolicThreadId(LogManager *this)

{
  bool bVar1;
  pointer ppVar2;
  _Base_ptr p_Var3;
  mapped_type_conflict2 *pmVar4;
  key_type local_38;
  _Self local_30;
  key_type local_28;
  _Self local_20;
  iterator sti;
  uint64_t symId;
  LogManager *this_local;
  
  sti._M_node = (_Base_ptr)0x0;
  local_28._M_thread = (native_handle_type)std::this_thread::get_id();
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::thread::id,_unsigned_long,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
       ::find(&this->_symbolicThreadIds,&local_28);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::thread::id,_unsigned_long,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
       ::end(&this->_symbolicThreadIds);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::thread::id,_unsigned_long>_>::operator->
                       (&local_20);
    sti._M_node = (_Base_ptr)ppVar2->second;
  }
  else {
    p_Var3 = (_Base_ptr)
             std::
             map<std::thread::id,_unsigned_long,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
             ::size(&this->_symbolicThreadIds);
    sti._M_node = p_Var3;
    local_38._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar4 = std::
             map<std::thread::id,_unsigned_long,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
             ::operator[](&this->_symbolicThreadIds,&local_38);
    *pmVar4 = (mapped_type_conflict2)p_Var3;
  }
  return (uint64_t)sti._M_node;
}

Assistant:

uint64_t LogManager::symbolicThreadId()
{
    uint64_t symId = 0;
    auto sti = _symbolicThreadIds.find(std::this_thread::get_id());
    if (sti != _symbolicThreadIds.end()) {
        symId = sti->second;
    }
    else {
        symId = _symbolicThreadIds.size();
        _symbolicThreadIds[std::this_thread::get_id()] = symId;
    }
    return symId;
}